

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weight_constraint.cpp
# Opt level: O1

void __thiscall Clasp::WeightConstraint::destroy(WeightConstraint *this,Solver *s,bool detach)

{
  WL WVar1;
  uint32 uVar2;
  ulong in_RAX;
  uint uVar3;
  uint32 dl;
  uint uVar4;
  undefined8 local_38;
  
  local_38 = in_RAX;
  if (s != (Solver *)0x0 && detach) {
    uVar3 = (uint)*this->lits_ & 0x3fffffff;
    if (uVar3 != 0) {
      uVar4 = 0;
      do {
        local_38._4_4_ = this->lits_[(ulong)(uVar4 << (SUB41(*this->lits_,3) >> 7)) + 1];
        Solver::removeWatch(s,(Literal *)((long)&local_38 + 4),&this->super_Constraint);
        local_38 = CONCAT44(local_38._4_4_,
                            this->lits_[(ulong)(uVar4 << (SUB41(*this->lits_,3) >> 7)) + 1]) &
                   0xfffffffffffffffe ^ 2;
        Solver::removeWatch(s,(Literal *)&local_38,&this->super_Constraint);
        uVar4 = uVar4 + 1;
      } while (uVar3 != uVar4);
    }
    uVar2 = 0;
    while( true ) {
      uVar3 = *(uint *)&this->field_0x10 & 0x7ffffff;
      WVar1 = *this->lits_;
      dl = 0;
      if (uVar3 != (uint)WVar1 >> 0x1f) {
        dl = *(uint *)((long)(s->assign_).assign_.ebo_.buf +
                      (ulong)((uint)this->lits_
                                    [(ulong)(((uint)this->bound_[(ulong)uVar3 + 1] >> 2) <<
                                            (WVar1._3_1_ >> 7)) + 1] & 0xfffffffc)) >> 4;
      }
      if (dl == 0) break;
      if (dl != uVar2) {
        Solver::removeUndoWatch(s,dl,&this->super_Constraint);
        uVar2 = dl;
      }
      *(uint *)&this->field_0x10 =
           *(uint *)&this->field_0x10 & 0xf8000000 | *(uint *)&this->field_0x10 - 1 & 0x7ffffff;
    }
  }
  if ((this->field_0x13 & 8) == 0) {
    WL::release(this->lits_);
  }
  (*(this->super_Constraint)._vptr_Constraint[0x10])(this);
  operator_delete(this);
  return;
}

Assistant:

void WeightConstraint::destroy(Solver* s, bool detach) {
	if (s && detach) {
		for (uint32 i = 0, end = size(); i != end; ++i) {
			s->removeWatch( lits_->lit(i), this );
			s->removeWatch(~lits_->lit(i), this );
		}
		for (uint32 last = 0, dl; (dl = highestUndoLevel(*s)) != 0; --up_) {
			if (dl != last) { s->removeUndoWatch(last = dl, this); }
		}
	}
	if (ownsLit_ == 0) { lits_->release(); }
	void* mem = static_cast<Constraint*>(this);
	this->~WeightConstraint();
	::operator delete(mem);
}